

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall
cubeb_DISABLED_resampler_duplex_Test::TestBody(cubeb_DISABLED_resampler_duplex_Test *this)

{
  uint32_t chunk_duration;
  uint32_t dest_rate;
  uint32_t source_rate_output;
  uint32_t source_rate_input;
  uint32_t output_channels;
  uint32_t input_channels;
  float in_stack_00000130;
  uint32_t in_stack_00000134;
  uint32_t in_stack_00000138;
  uint32_t in_stack_0000013c;
  uint32_t in_stack_00000140;
  uint32_t in_stack_00000144;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  
  for (local_c = 1; local_c < 3; local_c = local_c + 1) {
    for (local_10 = 1; local_10 < 3; local_10 = local_10 + 1) {
      for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
        for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
          for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
            for (local_20 = 10; local_20 < 0x1e; local_20 = local_20 + 10) {
              fprintf(_stderr,
                      "input channels:%d output_channels:%d input_rate:%d output_rate:%d target_rate:%d chunk_ms:%d\n"
                      ,(ulong)local_c,(ulong)local_10,(ulong)sample_rates[local_14],
                      (ulong)sample_rates[local_18],sample_rates[local_1c],local_20,sample_rates);
              test_resampler_duplex<float>
                        (in_stack_00000144,in_stack_00000140,in_stack_0000013c,in_stack_00000138,
                         in_stack_00000134,in_stack_00000130);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(cubeb, DISABLED_resampler_duplex)
{
  for (uint32_t input_channels = 1; input_channels <= max_channels; input_channels++) {
    for (uint32_t output_channels = 1; output_channels <= max_channels; output_channels++) {
      for (uint32_t source_rate_input = 0; source_rate_input < array_size(sample_rates); source_rate_input++) {
        for (uint32_t source_rate_output = 0; source_rate_output < array_size(sample_rates); source_rate_output++) {
          for (uint32_t dest_rate = 0; dest_rate < array_size(sample_rates); dest_rate++) {
            for (uint32_t chunk_duration = min_chunks; chunk_duration < max_chunks; chunk_duration+=chunk_increment) {
              fprintf(stderr, "input channels:%d output_channels:%d input_rate:%d "
                     "output_rate:%d target_rate:%d chunk_ms:%d\n",
                     input_channels, output_channels,
                     sample_rates[source_rate_input],
                     sample_rates[source_rate_output],
                     sample_rates[dest_rate],
                     chunk_duration);
              test_resampler_duplex<float>(input_channels, output_channels,
                                           sample_rates[source_rate_input],
                                           sample_rates[source_rate_output],
                                           sample_rates[dest_rate],
                                           chunk_duration);
            }
          }
        }
      }
    }
  }
}